

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O3

void __thiscall HEkkDualRow::updateDual(HEkkDualRow *this,double theta)

{
  int iVar1;
  int iVar2;
  HEkk *pHVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pcVar8;
  long lVar9;
  double dVar10;
  
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x49,0);
  pHVar3 = this->ekk_instance_;
  iVar1 = this->packCount;
  if ((long)iVar1 < 1) {
    dVar10 = 0.0;
  }
  else {
    pdVar4 = (pHVar3->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (pHVar3->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar8 = (pHVar3->basis_).nonbasicFlag_.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar10 = 0.0;
    lVar9 = 0;
    do {
      iVar2 = piVar5[lVar9];
      pdVar4[iVar2] = pdVar6[lVar9] * -theta + pdVar4[iVar2];
      dVar10 = dVar10 - pdVar6[lVar9] * theta * pdVar7[iVar2] * (double)(int)pcVar8[iVar2] *
                        pHVar3->cost_scale_;
      lVar9 = lVar9 + 1;
    } while (iVar1 != lVar9);
  }
  (pHVar3->info_).updated_dual_objective_value =
       dVar10 + (pHVar3->info_).updated_dual_objective_value;
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x49,0);
  return;
}

Assistant:

void HEkkDualRow::updateDual(double theta) {
  analysis->simplexTimerStart(UpdateDualClock);
  double* workDual = ekk_instance_.info_.workDual_.data();
  double dual_objective_value_change = 0;
  for (HighsInt i = 0; i < packCount; i++) {
    workDual[packIndex[i]] -= theta * packValue[i];
    // Identify the change to the dual objective
    HighsInt iCol = packIndex[i];
    const double delta_dual = theta * packValue[i];
    const double local_value = ekk_instance_.info_.workValue_[iCol];
    double local_dual_objective_change =
        ekk_instance_.basis_.nonbasicFlag_[iCol] * (-local_value * delta_dual);
    local_dual_objective_change *= ekk_instance_.cost_scale_;
    dual_objective_value_change += local_dual_objective_change;
  }
  ekk_instance_.info_.updated_dual_objective_value +=
      dual_objective_value_change;
  analysis->simplexTimerStop(UpdateDualClock);
}